

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queryFunctions.cpp
# Opt level: O1

vector<int,_std::allocator<int>_> * __thiscall
helics::vectorizeIndexQuery
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,helics *this,
          string_view queryres)

{
  pointer piVar1;
  _Alloc_hider __nptr;
  bool bVar2;
  int iVar3;
  reference j;
  int *piVar4;
  long lVar5;
  undefined8 uVar6;
  byte bVar7;
  char *pcVar8;
  iterator iVar9;
  json jVar10;
  string_view jsonString;
  int ret;
  iterator __begin4;
  json v;
  iterator __end4;
  double local_90;
  string local_88;
  data local_68;
  int local_54;
  iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
  local_50;
  
  pcVar8 = (char *)queryres._M_len;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (this == (helics *)0x0) {
    return __return_storage_ptr__;
  }
  if (*pcVar8 != '[') {
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_88,pcVar8,this + (long)pcVar8,queryres._M_str);
    __nptr._M_p = local_88._M_dataplus._M_p;
    piVar4 = __errno_location();
    iVar3 = *piVar4;
    *piVar4 = 0;
    lVar5 = strtol(__nptr._M_p,(char **)&local_50,10);
    if (local_50.m_object == (pointer)__nptr._M_p) {
      std::__throw_invalid_argument("stoi");
    }
    else {
      local_68._0_4_ = SUB84(lVar5,0);
      if (((int)local_68._0_4_ == lVar5) && (*piVar4 != 0x22)) {
        if (*piVar4 == 0) {
          *piVar4 = iVar3;
        }
        iVar9._M_current =
             (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar9._M_current ==
            (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    (__return_storage_ptr__,iVar9,(int *)&local_68);
        }
        else {
          *iVar9._M_current = local_68._0_4_;
          (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
          super__Vector_impl_data._M_finish = iVar9._M_current + 1;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88._M_dataplus._M_p == &local_88.field_2) {
          return __return_storage_ptr__;
        }
        operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
        return __return_storage_ptr__;
      }
    }
    uVar6 = std::__throw_out_of_range("stoi");
    piVar1 = (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if (piVar1 != (pointer)0x0) {
      operator_delete(piVar1,(long)(__return_storage_ptr__->
                                   super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                   super__Vector_impl_data._M_end_of_storage - (long)piVar1);
    }
    _Unwind_Resume(uVar6);
  }
  jsonString._M_str = (char *)this;
  jsonString._M_len = (size_t)&local_68;
  jVar10 = fileops::loadJsonStr_abi_cxx11_(jsonString);
  if (local_68.m_type == array) {
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::begin((iterator *)&local_88,
            (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
             *)&local_68);
    local_50.m_it.primitive_iterator.m_it = -0x8000000000000000;
    local_50.m_it.array_iterator._M_current = (pointer)0x0;
    local_50.m_it.object_iterator._M_node = (_Base_ptr)0x0;
    if (local_68.m_type == array) {
      local_50.m_it.array_iterator._M_current =
           ((local_68.m_value.array)->
           super__Vector_base<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
    }
    else if (local_68.m_type == object) {
      local_50.m_it.object_iterator._M_node =
           &((local_68.m_value.object)->_M_t)._M_impl.super__Rb_tree_header._M_header;
    }
    else {
      local_50.m_it.primitive_iterator.m_it = 1;
    }
    local_50.m_object = (pointer)&local_68;
    while (bVar2 = nlohmann::json_abi_v3_11_3::detail::
                   iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                   ::
                   operator==<nlohmann::json_abi_v3_11_3::detail::iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_nullptr>
                             ((iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                               *)&local_88,&local_50), !bVar2) {
      j = nlohmann::json_abi_v3_11_3::detail::
          iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
          ::operator*((iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                       *)&local_88);
      bVar7 = (j->m_data).m_type - number_integer;
      if (bVar7 < 2) {
        local_90 = (double)((ulong)local_90 & 0xffffffff00000000);
        nlohmann::json_abi_v3_11_3::detail::
        from_json<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_int,_0>
                  (j,(int *)&local_90);
        local_54 = local_90._0_4_;
        iVar9._M_current =
             (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar9._M_current ==
            (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    (__return_storage_ptr__,iVar9,&local_54);
        }
        else {
LAB_0027d163:
          *iVar9._M_current = local_54;
          (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
          super__Vector_impl_data._M_finish = iVar9._M_current + 1;
        }
      }
      else if (bVar7 == 2) {
        local_90 = 0.0;
        nlohmann::json_abi_v3_11_3::detail::
        get_arithmetic_value<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_double,_0>
                  (j,&local_90);
        local_54 = (int)local_90;
        iVar9._M_current =
             (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar9._M_current !=
            (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) goto LAB_0027d163;
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  (__return_storage_ptr__,iVar9,&local_54);
      }
      if (*local_88._M_dataplus._M_p == '\x02') {
        local_88.field_2._M_allocated_capacity = local_88.field_2._M_allocated_capacity + 0x10;
      }
      else if (*local_88._M_dataplus._M_p == '\x01') {
        local_88._M_string_length =
             std::_Rb_tree_increment((_Rb_tree_node_base *)local_88._M_string_length);
      }
      else {
        local_88.field_2._8_8_ = local_88.field_2._8_8_ + 1;
      }
    }
  }
  else {
    if ((byte)(local_68.m_type - number_integer) < 2) {
      local_90 = (double)((ulong)local_90 & 0xffffffff00000000);
      nlohmann::json_abi_v3_11_3::detail::
      from_json<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_int,_0>
                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)&local_68,(int *)&local_90);
      local_88._M_dataplus._M_p._0_4_ = local_90._0_4_;
      iVar9._M_current =
           (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      iVar3 = local_90._0_4_;
      if (iVar9._M_current ==
          (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  (__return_storage_ptr__,iVar9,(int *)&local_88);
        goto LAB_0027d270;
      }
    }
    else {
      if ((value_t)(local_68.m_type - number_integer) != 2) {
        if (local_68.m_type == string) {
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::
          get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    (&local_88,
                     (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                      *)&local_68,jVar10.m_data.m_value.object);
          iVar3 = std::__cxx11::stoi(&local_88,(size_t *)0x0,10);
          local_50.m_object = (pointer)CONCAT44(local_50.m_object._4_4_,iVar3);
          iVar9._M_current =
               (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar9._M_current ==
              (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                      (__return_storage_ptr__,iVar9,(int *)&local_50);
          }
          else {
            *iVar9._M_current = iVar3;
            (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
            super__Vector_impl_data._M_finish = iVar9._M_current + 1;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_dataplus._M_p == &local_88.field_2) goto LAB_0027d270;
        }
        else {
          local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_88,pcVar8,this + (long)pcVar8);
          iVar3 = std::__cxx11::stoi(&local_88,(size_t *)0x0,10);
          local_50.m_object = (pointer)CONCAT44(local_50.m_object._4_4_,iVar3);
          iVar9._M_current =
               (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar9._M_current ==
              (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                      (__return_storage_ptr__,iVar9,(int *)&local_50);
          }
          else {
            *iVar9._M_current = iVar3;
            (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
            super__Vector_impl_data._M_finish = iVar9._M_current + 1;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_dataplus._M_p == &local_88.field_2) goto LAB_0027d270;
        }
        operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
        goto LAB_0027d270;
      }
      local_90 = 0.0;
      nlohmann::json_abi_v3_11_3::detail::
      get_arithmetic_value<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_double,_0>
                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)&local_68,&local_90);
      iVar3 = (int)local_90;
      local_88._M_dataplus._M_p._0_4_ = iVar3;
      iVar9._M_current =
           (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar9._M_current ==
          (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  (__return_storage_ptr__,iVar9,(int *)&local_88);
        goto LAB_0027d270;
      }
    }
    *iVar9._M_current = iVar3;
    (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar9._M_current + 1;
  }
LAB_0027d270:
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::data::~data(&local_68);
  return __return_storage_ptr__;
}

Assistant:

std::vector<int> vectorizeIndexQuery(std::string_view queryres)
{
    std::vector<int> result;
    if (queryres.empty()) {
        return result;
    }

    if (queryres.front() == '[') {
        try {
            auto v = fileops::loadJsonStr(queryres);
            if (v.is_array()) {
                for (auto& val : v) {
                    if (val.is_number_integer()) {
                        result.push_back(val.get<int>());
                    } else if (val.is_number()) {
                        result.push_back(val.get<double>());
                    } else {
                        continue;
                    }
                }
            } else if (v.is_number_integer()) {
                result.push_back(v.get<int>());
            } else if (v.is_number()) {
                result.push_back(v.get<double>());
            } else if (v.is_string()) {
                result.push_back(std::stoi(v.get<std::string>()));
            } else {
                result.push_back(std::stoi(std::string(queryres)));
            }
            return result;
        }
        catch (...) {
        }
    }
    try {
        result.push_back(std::stoi(std::string(queryres)));
    }
    catch (const std::invalid_argument&) {
    }
    return result;
}